

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp analyze_let_syntax_aux(sexp ctx,sexp x,int recp,int depth)

{
  sexp psVar1;
  sexp env;
  sexp ctx2;
  sexp tmp;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_50.var = &env;
  env = (sexp)&DAT_0000043e;
  local_30.var = &ctx2;
  ctx2 = (sexp)&DAT_0000043e;
  local_40.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_30.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  local_40.next = &local_30;
  (ctx->value).context.saves = &local_40;
  psVar1 = (x->value).type.cpl;
  if ((((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) &&
      (psVar1 = (psVar1->value).type.cpl, ((ulong)psVar1 & 3) == 0)) && (psVar1->tag == 6)) {
    local_50.var = &env;
    env = sexp_alloc_tagged_aux(ctx,0x28,0x17);
    env->field_0x5 = env->field_0x5 | 8;
    (env->value).flonum = (double)(ctx->value).type.cpl;
    (env->value).uvector.length = 0x23e;
    (env->value).bytecode.length = 0x23e;
    ctx2 = sexp_make_child_context(ctx,(((ctx->value).opcode.methods)->value).type.getters);
    (ctx2->value).type.cpl = env;
    psVar1 = ctx2;
    if (recp == 0) {
      psVar1 = ctx;
    }
    tmp = analyze_bind_syntax((((x->value).type.cpl)->value).type.name,psVar1,ctx2,1);
    if ((((ulong)tmp & 3) != 0) || (tmp->tag != 0x13)) {
      tmp = analyze_seq(ctx2,(((x->value).type.cpl)->value).type.cpl,depth,1);
    }
  }
  else {
    tmp = sexp_compile_error(ctx,"bad let(rec)-syntax",x);
  }
  (ctx->value).context.saves = local_50.next;
  return tmp;
}

Assistant:

static sexp analyze_let_syntax_aux (sexp ctx, sexp x, int recp, int depth) {
  sexp res;
  sexp_gc_var3(env, ctx2, tmp);
  sexp_gc_preserve3(ctx, env, ctx2, tmp);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "bad let(rec)-syntax", x);
  } else {
    env = sexp_alloc_type(ctx, env, SEXP_ENV);
    sexp_env_syntactic_p(env) = 1;
    sexp_env_parent(env) = sexp_context_env(ctx);
    sexp_env_bindings(env) = SEXP_NULL;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
    sexp_env_renames(env) = SEXP_NULL;
#endif
    ctx2 = sexp_make_child_context(ctx, sexp_context_lambda(ctx));
    sexp_context_env(ctx2) = env;
    tmp = analyze_bind_syntax(sexp_cadr(x), (recp ? ctx2 : ctx), ctx2, 1);
    res = (sexp_exceptionp(tmp) ? tmp : analyze_seq(ctx2, sexp_cddr(x), depth, 1));
  }
  sexp_gc_release3(ctx);
  return res;
}